

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O2

void __thiscall toml::detail::location::reset(location *this,const_iterator rollback)

{
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> __first;
  difference_type dVar1;
  undefined1 local_12;
  undefined1 local_11;
  
  __first._M_current = (this->iter_)._M_current;
  if ((long)__first._M_current - (long)rollback._M_current < 0) {
    dVar1 = std::
            __count_if<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (__first,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                )rollback._M_current,(_Iter_equals_val<const_char>)&local_12);
    this->line_number_ = this->line_number_ + dVar1;
  }
  else {
    dVar1 = std::
            __count_if<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                       rollback._M_current,__first,(_Iter_equals_val<const_char>)&local_11);
    this->line_number_ = this->line_number_ - dVar1;
  }
  (this->iter_)._M_current = rollback._M_current;
  return;
}

Assistant:

void reset(const_iterator rollback) noexcept
    {
        // since c++11, std::distance works in both ways for random-access
        // iterators and returns a negative value if `first > last`.
        if(0 <= std::distance(rollback, this->iter_)) // rollback < iter
        {
            this->line_number_ -= static_cast<std::size_t>(
                    std::count(rollback, this->iter_, '\n'));
        }
        else // iter < rollback [[unlikely]]
        {
            this->line_number_ += static_cast<std::size_t>(
                    std::count(this->iter_, rollback, '\n'));
        }
        this->iter_ = rollback;
        return;
    }